

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void * prf_array_remove(void *id,int index)

{
  array *paVar1;
  int in_ESI;
  void *in_RDI;
  void **ptr;
  array *arr;
  
  paVar1 = id_to_array(in_RDI);
  if (in_ESI < (int)((*(uint *)&paVar1->field_0x4 >> 4) - 1)) {
    memmove((void *)((long)in_RDI + (long)in_ESI * 8),
            (void *)((long)in_RDI + (long)(in_ESI + 1) * 8),
            (long)(int)(((*(uint *)&paVar1->field_0x4 >> 4) - in_ESI) + -1) << 3);
  }
  *(uint *)&paVar1->field_0x4 =
       *(uint *)&paVar1->field_0x4 & 0xf | ((*(uint *)&paVar1->field_0x4 >> 4) - 1) * 0x10;
  return in_RDI;
}

Assistant:

void *
prf_array_remove(void *id, int index)
{
  array * arr;
  assert( id != NULL && index >= 0 );
  arr = id_to_array(id);
  assert( index < arr->numelem && arr->numelem >= 0 );
  if ( (arr->numelem - 1) > index ) {
    void ** ptr = (void **) id;
    assert( ((arr->numelem - index - 1) * sizeof(void *)) > 0 );
    memmove( ((char *) ptr) + (index * sizeof(void *)),
             ((char *) ptr) + ((index + 1) * sizeof(void *)),
             (arr->numelem - index - 1) * sizeof(void *));
  }
#ifndef NDEBUG
  else {
    assert( index == arr->numelem );
  }
#endif /* ! NDEBUG */
  arr->numelem--;
  return id;
}